

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void * crnd::crnd_malloc(size_t size,size_t *pActual_size)

{
  uint8 *p_new;
  size_t actual_size;
  size_t *pActual_size_local;
  size_t size_local;
  
  pActual_size_local = (size_t *)(size + 3 & 0xfffffffffffffffc);
  if (pActual_size_local == (size_t *)0x0) {
    pActual_size_local = (size_t *)0x4;
  }
  actual_size = (size_t)pActual_size;
  if (pActual_size_local < (size_t *)0x7fff0001) {
    p_new = (uint8 *)pActual_size_local;
    size_local = (*(code *)g_pRealloc)(0,pActual_size_local,&p_new,1,g_pUser_data);
    if (actual_size != 0) {
      *(uint8 **)actual_size = p_new;
    }
    if ((size_local == 0) || (p_new < pActual_size_local)) {
      crnd_mem_error("crnd_malloc: out of memory");
      size_local = 0;
    }
  }
  else {
    crnd_mem_error("crnd_malloc: size too big");
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void* crnd_malloc(size_t size, size_t* pActual_size)
    {
        size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
        if (!size)
            size = sizeof(uint32);

        if (size > MAX_POSSIBLE_BLOCK_SIZE)
        {
            crnd_mem_error("crnd_malloc: size too big");
            return NULL;
        }

        size_t actual_size = size;
        uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

        if (pActual_size)
            *pActual_size = actual_size;

        if ((!p_new) || (actual_size < size))
        {
            crnd_mem_error("crnd_malloc: out of memory");
            return NULL;
        }

        CRND_ASSERT(((uint32) reinterpret_cast<uintptr_t>(p_new) & (CRND_MIN_ALLOC_ALIGNMENT - 1)) == 0);

        return p_new;
    }